

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O3

void __thiscall
QKmsDevice::QKmsDevice(QKmsDevice *this,QKmsScreenConfig *screenConfig,QString *path)

{
  Data *pDVar1;
  QKmsScreenConfig *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  QArrayData *pQVar5;
  QKmsDevice *this_00;
  long in_FS_OFFSET;
  QArrayData *local_50;
  undefined8 *local_48;
  undefined4 local_38;
  undefined8 local_34;
  undefined8 uStack_2c;
  undefined4 local_24;
  char16_t *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QKmsDevice = (_func_int **)&PTR__QKmsDevice_00125640;
  this->m_screenConfig = screenConfig;
  pDVar1 = (path->d).d;
  (this->m_path).d.d = pDVar1;
  (this->m_path).d.ptr = (path->d).ptr;
  (this->m_path).d.size = (path->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this->m_dri_fd = -1;
  this->m_has_atomic_support = false;
  QThreadStorageData::QThreadStorageData
            (&(this->m_atomicReqs).d,QThreadStorage<QKmsDevice::AtomicReqs>::deleteData);
  (this->m_planes).d.ptr = (QKmsPlane *)0x0;
  (this->m_planes).d.size = 0;
  *(undefined8 *)&this->m_crtc_allocator = 0;
  *(undefined8 *)((long)&(this->m_planes).d.d + 4) = 0;
  if ((this->m_path).d.size == 0) {
    pQVar2 = this->m_screenConfig;
    pDVar1 = (pQVar2->m_devicePath).d.d;
    pcVar3 = (pQVar2->m_devicePath).d.ptr;
    qVar4 = (pQVar2->m_devicePath).d.size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQVar5 = &((this->m_path).d.d)->super_QArrayData;
    (this->m_path).d.d = pDVar1;
    (this->m_path).d.ptr = pcVar3;
    (this->m_path).d.size = qVar4;
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,2,0x10);
      }
    }
    qLcKmsDebug();
    if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_38 = 2;
      local_34 = 0;
      uStack_2c = 0;
      local_24 = 0;
      local_20 = (char16_t *)qLcKmsDebug::category.name;
      QString::toLocal8Bit_helper((QChar *)&local_50,(longlong)(this->m_path).d.ptr);
      if (local_48 == (undefined8 *)0x0) {
        local_48 = &QByteArray::_empty;
      }
      QMessageLogger::debug
                ((char *)&stack0xffffffffffffffc8,"Using DRM device %s specified in config file",
                 local_48);
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,1,0x10);
        }
      }
    }
    if ((this->m_path).d.size == 0) {
      this_00 = (QKmsDevice *)&stack0xffffffffffffffc8;
      QKmsDevice(this_00);
      this_00->_vptr_QKmsDevice = (_func_int **)&PTR__QKmsDevice_00125640;
      threadLocalAtomicReset(this_00);
      QArrayDataPointer<QKmsPlane>::~QArrayDataPointer(&(this_00->m_planes).d);
      QThreadStorageData::~QThreadStorageData(&(this_00->m_atomicReqs).d);
      pDVar1 = (this_00->m_path).d.d;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&((this_00->m_path).d.d)->super_QArrayData,2,0x10);
          return;
        }
      }
      return;
    }
  }
  else {
    qLcKmsDebug();
    if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_38 = 2;
      local_34 = 0;
      uStack_2c = 0;
      local_24 = 0;
      local_20 = (char16_t *)qLcKmsDebug::category.name;
      QString::toLocal8Bit_helper((QChar *)&local_50,(longlong)(this->m_path).d.ptr);
      if (local_48 == (undefined8 *)0x0) {
        local_48 = &QByteArray::_empty;
      }
      QMessageLogger::debug
                ((char *)&stack0xffffffffffffffc8,"Using backend-provided DRM device %s",local_48);
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,1,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QKmsDevice::QKmsDevice(QKmsScreenConfig *screenConfig, const QString &path)
    : m_screenConfig(screenConfig)
    , m_path(path)
    , m_dri_fd(-1)
    , m_has_atomic_support(false)
    , m_crtc_allocator(0)
{
    if (m_path.isEmpty()) {
        m_path = m_screenConfig->devicePath();
        qCDebug(qLcKmsDebug, "Using DRM device %s specified in config file", qPrintable(m_path));
        if (m_path.isEmpty())
            qFatal("No DRM device given");
    } else {
        qCDebug(qLcKmsDebug, "Using backend-provided DRM device %s", qPrintable(m_path));
    }
}